

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FileDescriptor *from_file,Descriptor *desc)

{
  bool bVar1;
  string sStack_48;
  
  bVar1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           (from_file + 8),"google.protobuf.bridge.MessageSet");
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"jspb.Message.messageSetExtensions",
               (allocator *)&sStack_48);
  }
  else {
    MaybeCrossFileRef_abi_cxx11_(&sStack_48,this,options,from_file,desc);
    std::operator+(__return_storage_ptr__,&sStack_48,".extensions");
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JSExtensionsObjectName(const GeneratorOptions& options,
                                   const FileDescriptor* from_file,
                                   const Descriptor* desc) {
  if (desc->full_name() == "google.protobuf.bridge.MessageSet") {
    // TODO(haberman): fix this for the kImportCommonJs case.
    return "jspb.Message.messageSetExtensions";
  } else {
    return MaybeCrossFileRef(options, from_file, desc) + ".extensions";
  }
}